

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

void __thiscall
TTD::UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::UnorderedArrayList
          (UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL> *this,
          SlabAllocator *alloc)

{
  FunctionBodyResolveInfo *pFVar1;
  FunctionBodyResolveInfo *newBlockData;
  SlabAllocator *alloc_local;
  UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL> *this_local;
  
  this->m_alloc = alloc;
  pFVar1 = SlabAllocatorBase<0>::
           SlabAllocateFixedSizeArray<TTD::NSSnapValues::FunctionBodyResolveInfo,2048ul>
                     (this->m_alloc);
  (this->m_inlineHeadBlock).BlockData = pFVar1;
  (this->m_inlineHeadBlock).CurrPos = pFVar1;
  (this->m_inlineHeadBlock).EndPos = pFVar1 + 0x800;
  (this->m_inlineHeadBlock).Next = (UnorderedArrayListLink *)0x0;
  return;
}

Assistant:

UnorderedArrayList(SlabAllocator* alloc)
            : m_alloc(alloc)
        {
            T* newBlockData = this->m_alloc->template SlabAllocateFixedSizeArray<T, allocSize>();

            this->m_inlineHeadBlock.BlockData = newBlockData;
            this->m_inlineHeadBlock.CurrPos = newBlockData;
            this->m_inlineHeadBlock.EndPos = newBlockData + allocSize;

            this->m_inlineHeadBlock.Next = nullptr;
        }